

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

double __thiscall
QLocaleData::stringToDouble(QLocaleData *this,QStringView str,bool *ok,NumberOptions number_options)

{
  bool bVar1;
  undefined1 *in_RCX;
  qsizetype in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QSimpleParsedNumber<double> QVar2;
  QStringView in_stack_00000000;
  QSimpleParsedNumber<double> r;
  CharBuff buff;
  QVarLengthArray<char,_256LL> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe90;
  double dVar3;
  double local_168;
  CharBuff *in_stack_fffffffffffffea0;
  NumberMode in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  QVarLengthArray<char,_256LL> local_120;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_120,0xaa,0x118);
  QVarLengthArray<char,_256LL>::QVarLengthArray(&local_120);
  bVar1 = numberToCLocale((QLocaleData *)CONCAT44(in_R8D,in_stack_fffffffffffffeb0),
                          in_stack_00000000,
                          (QFlagsStorageHelper<QLocale::NumberOption,_4>)
                          SUB84((ulong)lVar4 >> 0x20,0),in_stack_fffffffffffffeac,
                          in_stack_fffffffffffffea0);
  if (bVar1) {
    local_168 = -NAN;
    QVarLengthArray<char,_256LL>::constData((QVarLengthArray<char,_256LL> *)0x4cc5ed);
    QVLABaseBase::size((QVLABaseBase *)&local_120);
    QVar2 = qt_asciiToDouble(in_stack_fffffffffffffe90,in_RDI,
                             (StrayCharacterMode)((ulong)in_RCX >> 0x20));
    local_168 = QVar2.result;
    dVar3 = local_168;
    if (in_RCX != (undefined1 *)0x0) {
      bVar1 = QSimpleParsedNumber<double>::ok((QSimpleParsedNumber<double> *)&local_168);
      *in_RCX = bVar1;
      dVar3 = local_168;
    }
  }
  else {
    if (in_RCX != (undefined1 *)0x0) {
      *in_RCX = 0;
    }
    dVar3 = 0.0;
  }
  QVarLengthArray<char,_256LL>::~QVarLengthArray(in_stack_fffffffffffffe30);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return dVar3;
}

Assistant:

double QLocaleData::stringToDouble(QStringView str, bool *ok,
                                   QLocale::NumberOptions number_options) const
{
    CharBuff buff;
    if (!numberToCLocale(str, number_options, DoubleScientificMode, &buff)) {
        if (ok != nullptr)
            *ok = false;
        return 0.0;
    }
    auto r = qt_asciiToDouble(buff.constData(), buff.size() - 1);
    if (ok != nullptr)
        *ok = r.ok();
    return r.result;
}